

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O1

void __thiscall
ON_SubDFaceIterator::ON_SubDFaceIterator(ON_SubDFaceIterator *this,ON_SubD *subd,uint level_index)

{
  ON_SubDLevel *pOVar1;
  ON_SubDRef OStack_38;
  
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_face_current = (ON_SubDFace *)0x0;
  this->m_face_index = 0;
  this->m_face_count = 0;
  this->m_face_first = (ON_SubDFace *)0x0;
  this->m_face_last = (ON_SubDFace *)0x0;
  (this->m_component_ptr).m_ptr = 0;
  pOVar1 = ON_SubD::LevelForExperts(subd,level_index);
  ON_SubDRef::CreateReferenceForExperts(&OStack_38,subd);
  Internal_Init(this,&OStack_38,pOVar1->m_face_count,pOVar1->m_face[0],pOVar1->m_face[1],
                (ON_SubDComponentPtr)0x0);
  ON_SubDRef::~ON_SubDRef(&OStack_38);
  return;
}

Assistant:

ON_SubDFaceIterator::ON_SubDFaceIterator(
  const class ON_SubD& subd,
  unsigned level_index

)
{
  const ON_SubDLevel& level = subd.LevelForExperts(level_index);
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    level.m_face_count,
    level.m_face[0],
    level.m_face[1],
    ON_SubDComponentPtr::Null
  );
}